

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superfamiconv.cpp
# Opt level: O1

int superfamiconv(int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  pointer pSVar6;
  undefined2 uVar7;
  bool bVar8;
  pointer pIVar9;
  undefined8 uVar10;
  pointer puVar11;
  pointer puVar12;
  pointer puVar13;
  pointer poVar14;
  char **argv_00;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  Mode MVar18;
  int iVar19;
  runtime_error *prVar20;
  _Base_ptr p_Var21;
  Mode extraout_EDX;
  Mode extraout_EDX_00;
  Mode extraout_EDX_01;
  _Rb_tree_header *p_Var22;
  ulong uVar23;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  uint uVar26;
  Image *crop;
  pointer image;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar27;
  uint uVar28;
  ulong uVar29;
  string *group;
  pointer poVar30;
  int iVar31;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  string_view fmt;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  string_view fmt_11;
  string_view fmt_12;
  string_view fmt_13;
  string_view fmt_14;
  string_view fmt_15;
  string_view fmt_16;
  string_view fmt_17;
  string_view fmt_18;
  string_view fmt_19;
  format_args args_15;
  format_args args_16;
  bool verbose;
  bool license;
  vector<sfc::Image,_std::allocator<sfc::Image>_> crops;
  string mode_str;
  bool help;
  Options options;
  Map map;
  bool local_e41;
  int local_e40;
  Palette local_e38;
  vector<sfc::Image,_std::allocator<sfc::Image>_> local_e08;
  undefined1 local_de8 [8];
  undefined8 uStack_de0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_dd8;
  pointer puStack_dc8;
  pointer local_dc0;
  pointer puStack_db8;
  _Base_ptr p_Stack_db0;
  _Base_ptr local_da8;
  _Base_ptr p_Stack_da0;
  pointer puStack_d98;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_d90;
  undefined1 local_d58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d48;
  vector<sfc::Tile,_std::allocator<sfc::Tile>_> local_d38;
  undefined1 local_d18 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  undefined5 local_cf8;
  undefined3 uStack_cf3;
  rgba_t local_cf0;
  uint uStack_cec;
  pointer local_ce0;
  pointer local_cd8;
  pointer local_cc8;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_cc0;
  undefined1 local_c88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c78;
  pointer puStack_c68;
  pointer local_c60;
  pointer local_c58;
  _Base_ptr p_Stack_c50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c48;
  pointer poStack_c30;
  pointer local_c28;
  _Base_ptr p_Stack_c20;
  _Base_ptr local_c18;
  _Base_ptr p_Stack_c10;
  _Base_ptr local_c08;
  _Base_ptr local_c00;
  _Base_ptr local_bf8;
  size_t local_bf0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_be8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_bb8;
  int local_b88;
  _Alloc_hider local_b80;
  size_type local_b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b70;
  undefined1 local_b60 [160];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  undefined1 local_aa0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  Mode local_a60;
  uint uStack_a5c;
  uint uStack_a58;
  uint uStack_a54;
  bool bStack_a50;
  bool bStack_a4f;
  bool abStack_a4e [2];
  int local_a4c [2];
  bool local_a44 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  Map local_a20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_9f0;
  char **local_9e8;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  undefined1 local_440 [32];
  string local_420;
  string local_400;
  string local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  vector<sfc::Image,_std::allocator<sfc::Image>_> local_60;
  rgba_vec_t local_48;
  
  local_b60._0_8_ = local_b60 + 0x10;
  local_b60._8_8_ = (pointer)0x0;
  local_b60[0x10] = '\0';
  local_b60._32_8_ = local_b60 + 0x30;
  local_b60._40_8_ = (pointer)0x0;
  local_b60[0x30] = '\0';
  local_b60._64_8_ = local_b60 + 0x50;
  local_b60._72_8_ = (pointer)0x0;
  local_b60[0x50] = '\0';
  local_b60._96_8_ = local_b60 + 0x70;
  local_b60._104_8_ = (pointer)0x0;
  local_b60[0x70] = '\0';
  local_b60._128_8_ = local_b60 + 0x90;
  local_b60._136_8_ = (Image *)0x0;
  local_b60[0x90] = '\0';
  local_ac0._M_dataplus._M_p = (pointer)&local_ac0.field_2;
  local_ac0._M_string_length = 0;
  local_ac0.field_2._M_local_buf[0] = '\0';
  local_aa0._0_8_ = local_aa0 + 0x10;
  local_aa0._8_8_ = (Image *)0x0;
  local_aa0[0x10] = '\0';
  local_a80._M_dataplus._M_p = (pointer)&local_a80.field_2;
  local_a80._M_string_length = 0;
  local_a80.field_2._M_local_buf[0] = '\0';
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  bStack_a50 = false;
  bStack_a4f = false;
  abStack_a4e[0] = false;
  local_a60 = none;
  uStack_a5c = 0;
  uStack_a58 = 0;
  uStack_a54 = 0;
  local_a44[0] = false;
  local_a4c[0] = 0;
  local_a4c[1] = 0;
  local_a40._M_string_length = 0;
  local_a40.field_2._M_local_buf[0] = '\0';
  local_e41 = false;
  local_de8 = (undefined1  [8])&local_dd8;
  uStack_de0 = (pointer)0x0;
  local_dd8._M_allocated_capacity = local_dd8._M_allocated_capacity & 0xffffffffffffff00;
  local_c88._0_8_ = local_c88 + 0x10;
  local_c88._8_8_ = (pointer)0x0;
  local_c78._M_allocated_capacity = local_c78._M_allocated_capacity & 0xffffffffffffff00;
  local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_c58;
  local_c58 = (pointer)((ulong)local_c58 & 0xffffffff00000000);
  p_Stack_c50 = (_Base_ptr)0x0;
  local_c00 = (_Base_ptr)&p_Stack_c10;
  p_Stack_c10 = (_Base_ptr)((ulong)p_Stack_c10 & 0xffffffff00000000);
  local_c08 = (_Base_ptr)0x0;
  local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poStack_c30 = (pointer)0x0;
  local_c28 = (pointer)0x0;
  p_Stack_c20 = (_Base_ptr)0x0;
  local_bf0 = 0;
  local_be8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_be8._M_impl.super__Rb_tree_header._M_header;
  local_be8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_be8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_be8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_bb8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_bb8._M_impl.super__Rb_tree_header._M_header;
  local_bb8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_bb8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_bb8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b88 = 0x100;
  local_b80._M_p = (pointer)&local_b70;
  local_b78 = 0;
  local_b70._M_local_buf[0] = '\0';
  puStack_c68 = (pointer)0x1c00000002;
  local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_bf8 = local_c00;
  local_be8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_be8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_bb8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_bb8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_9f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b80._M_p;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c88,0,0,
             "Usage: superfamiconv <command> [<options>]\n\nAvailable commands: palette, tiles, map or blank for \"shorthand mode\"\nInvoke with <command> --help for further help\n\nShorthand mode options:\n"
             ,0xb9);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,"in-image","");
  local_e40 = argc;
  local_9e8 = argv;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"Input: image","");
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60,'i',
             &local_460,&local_480,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a0,"out-palette","");
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c0,"Output: palette data","");
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b60 + 0x20)
             ,'p',&local_4a0,&local_4c0,&local_c0,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
    operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1);
  }
  local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e0,"out-tiles","");
  local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"Output: tile data","");
  local_100._M_string_length = 0;
  local_100.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b60 + 0x40)
             ,'t',&local_4e0,&local_500,&local_100,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,
                    CONCAT71(local_100.field_2._M_allocated_capacity._1_7_,
                             local_100.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_500._M_dataplus._M_p != &local_500.field_2) {
    operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_520,"out-map","");
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"Output: map data","");
  local_140._M_string_length = 0;
  local_140.field_2._M_local_buf[0] = '\0';
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b60 + 0x60)
             ,'m',&local_520,&local_540,&local_140,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_520._M_dataplus._M_p != &local_520.field_2) {
    operator_delete(local_520._M_dataplus._M_p,local_520.field_2._M_allocated_capacity + 1);
  }
  local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"out-palette-image","");
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_580,"Output: palette image","");
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_b60 + 0x80)
             ,'\0',&local_560,&local_580,&local_180,&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,
                    CONCAT71(local_180.field_2._M_allocated_capacity._1_7_,
                             local_180.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"out-palette-act","");
  local_5c0._M_dataplus._M_p = (pointer)&local_5c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5c0,"Output: photoshop palette","");
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,&local_ac0,'\0',&local_5a0,&local_5c0,&local_1c0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
    operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"out-tiles-image","");
  local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"Output: tiles image","");
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa0,'\0',
             &local_5e0,&local_600,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,
                    CONCAT71(local_200.field_2._M_allocated_capacity._1_7_,
                             local_200.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_600._M_dataplus._M_p != &local_600.field_2) {
    operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  local_620._M_dataplus._M_p = (pointer)&local_620.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_620,"out-scaled-image","");
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_640,"Output: image scaled to destination colorspace","");
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,&local_a80,'\0',&local_620,&local_640,&local_240,&local_260);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_620._M_dataplus._M_p != &local_620.field_2) {
    operator_delete(local_620._M_dataplus._M_p,local_620.field_2._M_allocated_capacity + 1);
  }
  local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"mode","");
  local_680._M_dataplus._M_p = (pointer)&local_680.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_680,"Mode <default: snes>","");
  local_6a0._M_dataplus._M_p = (pointer)&local_6a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6a0,"snes","");
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Settings","");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_de8,'M',
             &local_660,&local_680,&local_6a0,&local_280);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6a0._M_dataplus._M_p != &local_6a0.field_2) {
    operator_delete(local_6a0._M_dataplus._M_p,local_6a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680._M_dataplus._M_p != &local_680.field_2) {
    operator_delete(local_680._M_dataplus._M_p,local_680.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_660._M_dataplus._M_p != &local_660.field_2) {
    operator_delete(local_660._M_dataplus._M_p,local_660.field_2._M_allocated_capacity + 1);
  }
  local_6c0._M_dataplus._M_p = (pointer)&local_6c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"bpp","");
  local_6e0._M_dataplus._M_p = (pointer)&local_6e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6e0,"Bits per pixel","");
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c88,&uStack_a5c,'B',&local_6c0,&local_6e0,4,&local_2a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0._M_dataplus._M_p != &local_6e0.field_2) {
    operator_delete(local_6e0._M_dataplus._M_p,local_6e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
    operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
  }
  local_700._M_dataplus._M_p = (pointer)&local_700.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_700,"tile-width","");
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_720,"Tile width","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c88,&uStack_a58,'W',&local_700,&local_720,8,&local_2c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_700._M_dataplus._M_p != &local_700.field_2) {
    operator_delete(local_700._M_dataplus._M_p,local_700.field_2._M_allocated_capacity + 1);
  }
  local_740._M_dataplus._M_p = (pointer)&local_740.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_740,"tile-height","");
  local_760._M_dataplus._M_p = (pointer)&local_760.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_760,"Tile height","");
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Settings","");
  Options::Add<unsigned_int>
            ((Options *)local_c88,&uStack_a54,'H',&local_740,&local_760,8,&local_2e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._M_dataplus._M_p != &local_760.field_2) {
    operator_delete(local_760._M_dataplus._M_p,local_760.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_740._M_dataplus._M_p != &local_740.field_2) {
    operator_delete(local_740._M_dataplus._M_p,local_740.field_2._M_allocated_capacity + 1);
  }
  local_780._M_dataplus._M_p = (pointer)&local_780.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_780,"no-remap","");
  local_7a0._M_dataplus._M_p = (pointer)&local_7a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a0,"Don\'t remap colors","");
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Settings","");
  Options::AddSwitch((Options *)local_c88,&bStack_a50,'R',&local_780,&local_7a0,false,&local_300);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0._M_dataplus._M_p != &local_7a0.field_2) {
    operator_delete(local_7a0._M_dataplus._M_p,local_7a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780._M_dataplus._M_p != &local_780.field_2) {
    operator_delete(local_780._M_dataplus._M_p,local_780.field_2._M_allocated_capacity + 1);
  }
  local_7c0._M_dataplus._M_p = (pointer)&local_7c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c0,"no-discard","");
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7e0,"Don\'t discard redundant tiles","");
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"Settings","");
  Options::AddSwitch((Options *)local_c88,&bStack_a4f,'D',&local_7c0,&local_7e0,false,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p,local_7e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
    operator_delete(local_7c0._M_dataplus._M_p,local_7c0.field_2._M_allocated_capacity + 1);
  }
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"no-flip","");
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_820,"Don\'t discard using tile flipping","");
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Settings","");
  Options::AddSwitch((Options *)local_c88,abStack_a4e,'F',&local_800,&local_820,false,&local_340);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820._M_dataplus._M_p != &local_820.field_2) {
    operator_delete(local_820._M_dataplus._M_p,local_820.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_800._M_dataplus._M_p != &local_800.field_2) {
    operator_delete(local_800._M_dataplus._M_p,local_800.field_2._M_allocated_capacity + 1);
  }
  local_840._M_dataplus._M_p = (pointer)&local_840.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_840,"tile-base-offset","");
  local_860._M_dataplus._M_p = (pointer)&local_860.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_860,"Tile base offset for map data","");
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"Settings","");
  Options::Add<int>((Options *)local_c88,local_a4c,'T',&local_840,&local_860,0,&local_360);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_860._M_dataplus._M_p != &local_860.field_2) {
    operator_delete(local_860._M_dataplus._M_p,local_860.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_840._M_dataplus._M_p != &local_840.field_2) {
    operator_delete(local_840._M_dataplus._M_p,local_840.field_2._M_allocated_capacity + 1);
  }
  local_880._M_dataplus._M_p = (pointer)&local_880.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_880,"palette-base-offset","");
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8a0,"Palette base offset for map data","");
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"Settings","");
  Options::Add<int>((Options *)local_c88,local_a4c + 1,'P',&local_880,&local_8a0,0,&local_380);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880._M_dataplus._M_p != &local_880.field_2) {
    operator_delete(local_880._M_dataplus._M_p,local_880.field_2._M_allocated_capacity + 1);
  }
  local_8c0._M_dataplus._M_p = (pointer)&local_8c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"sprite-mode","");
  local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_8e0,"Apply sprite output settings","");
  group = &local_3a0;
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)group,"Settings","");
  Options::AddSwitch((Options *)local_c88,local_a44,'S',&local_8c0,&local_8e0,false,group);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0._M_dataplus._M_p != &local_8c0.field_2) {
    operator_delete(local_8c0._M_dataplus._M_p,local_8c0.field_2._M_allocated_capacity + 1);
  }
  local_900._M_dataplus._M_p = (pointer)&local_900.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_900,"color-zero","");
  local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"Set color #0","");
  local_3c0._M_string_length = 0;
  local_3c0.field_2._M_local_buf[0] = '\0';
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"Settings","");
  Options::Add<std::__cxx11::string>
            ((Options *)local_c88,&local_a40,'\0',&local_900,&local_920,&local_3c0,&local_3e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,
                    CONCAT71(local_3c0.field_2._M_allocated_capacity._1_7_,
                             local_3c0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_920._M_dataplus._M_p != &local_920.field_2) {
    operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_900._M_dataplus._M_p != &local_900.field_2) {
    operator_delete(local_900._M_dataplus._M_p,local_900.field_2._M_allocated_capacity + 1);
  }
  local_940._M_dataplus._M_p = (pointer)&local_940.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_940,"verbose","");
  local_960._M_dataplus._M_p = (pointer)&local_960.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"Verbose logging","");
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"_","");
  Options::AddSwitch((Options *)local_c88,&local_e41,'v',&local_940,&local_960,false,&local_400);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_960._M_dataplus._M_p != &local_960.field_2) {
    operator_delete(local_960._M_dataplus._M_p,local_960.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_940._M_dataplus._M_p != &local_940.field_2) {
    operator_delete(local_940._M_dataplus._M_p,local_940.field_2._M_allocated_capacity + 1);
  }
  local_980._M_dataplus._M_p = (pointer)&local_980.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_980,"license","");
  local_9a0._M_dataplus._M_p = (pointer)&local_9a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9a0,"Show licenses","");
  local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_420,"_","");
  Options::AddSwitch((Options *)local_c88,(bool *)&local_e38,'l',&local_980,&local_9a0,false,
                     &local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_420._M_dataplus._M_p != &local_420.field_2) {
    operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0._M_dataplus._M_p != &local_9a0.field_2) {
    operator_delete(local_9a0._M_dataplus._M_p,local_9a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980._M_dataplus._M_p != &local_980.field_2) {
    operator_delete(local_980._M_dataplus._M_p,local_980.field_2._M_allocated_capacity + 1);
  }
  local_9c0._M_dataplus._M_p = (pointer)&local_9c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9c0,"help","");
  local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9e0,"Show this help","");
  p_Var24 = (_Base_ptr)(local_440 + 0x10);
  local_440._0_8_ = p_Var24;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_440,"_","");
  aVar27.values_ = (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)0x0;
  Options::AddSwitch((Options *)local_c88,(bool *)local_d58,'h',&local_9c0,&local_9e0,false,
                     (string *)local_440);
  if ((_Base_ptr)local_440._0_8_ != p_Var24) {
    operator_delete((void *)local_440._0_8_,local_440._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
    operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
  }
  argv_00 = local_9e8;
  iVar31 = local_e40;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9c0._M_dataplus._M_p != &local_9c0.field_2) {
    operator_delete(local_9c0._M_dataplus._M_p,local_9c0.field_2._M_allocated_capacity + 1);
  }
  bVar15 = Options::Parse((Options *)local_c88,iVar31,argv_00);
  if (bVar15) {
    if ((iVar31 < 2) || (local_d58[0] == true)) {
      Options::Usage_abi_cxx11_((string *)local_d18,(Options *)local_c88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_d18._0_8_,local_d18._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d18._0_8_ != &local_d08) {
        operator_delete((void *)local_d18._0_8_,(ulong)(local_d08._M_allocated_capacity + 1));
      }
    }
    else {
      if ((undefined1)local_e38._mode != snes) {
        MVar18 = sfc::mode((string *)local_de8);
        local_a60 = pce_sprite;
        if (local_a44[0] == false) {
          local_a60 = MVar18;
        }
        if (MVar18 != pce) {
          local_a60 = MVar18;
        }
        if (local_a60 == pce_sprite) {
          local_a44[0] = true;
        }
        local_d18._0_8_ = &local_d08;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d18,"bpp","");
        p_Var25 = local_bb8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar14 = local_c28;
        uVar10 = local_d18._0_8_;
        poVar30 = poStack_c30;
        if (poStack_c30 == local_c28) {
          group = (string *)0x0;
          p_Var25 = p_Var24;
        }
        else {
          do {
            iVar31 = poVar30->val;
            iVar19 = strcmp(poVar30->name,(char *)uVar10);
            if (iVar19 == 0) {
              p_Var1 = &local_bb8._M_impl.super__Rb_tree_header;
              p_Var21 = &p_Var1->_M_header;
              for (p_Var24 = p_Var25; (_Rb_tree_header *)p_Var24 != (_Rb_tree_header *)0x0;
                  p_Var24 = (&p_Var24->_M_left)[(int)*(size_t *)(p_Var24 + 1) < iVar31]) {
                if (iVar31 <= (int)*(size_t *)(p_Var24 + 1)) {
                  p_Var21 = p_Var24;
                }
              }
              p_Var22 = p_Var1;
              if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
                 (p_Var22 = (_Rb_tree_header *)p_Var21,
                 iVar31 < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
                p_Var22 = p_Var1;
              }
              group = (string *)(ulong)(p_Var22 != p_Var1);
            }
            if (iVar19 == 0) goto LAB_00127a2a;
            poVar30 = poVar30 + 1;
          } while (poVar30 != poVar14);
          group = (string *)0x0;
        }
LAB_00127a2a:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._0_8_ != &local_d08) {
          operator_delete((void *)local_d18._0_8_,(ulong)(local_d08._M_allocated_capacity + 1));
        }
        if (((ulong)group & 1) == 0) {
          uStack_a5c = 4;
          if ((ulong)local_a60 < 0x11) {
            uStack_a5c = *(uint *)(&DAT_001614a4 + (ulong)local_a60 * 4);
          }
        }
        local_d18._0_8_ = &local_d08;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d18,"tile-width","");
        p_Var24 = local_bb8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar14 = local_c28;
        uVar10 = local_d18._0_8_;
        poVar30 = poStack_c30;
        if (poStack_c30 == local_c28) {
          group = (string *)0x0;
          p_Var24 = p_Var25;
        }
        else {
          do {
            iVar31 = poVar30->val;
            iVar19 = strcmp(poVar30->name,(char *)uVar10);
            if (iVar19 == 0) {
              p_Var1 = &local_bb8._M_impl.super__Rb_tree_header;
              p_Var21 = &p_Var1->_M_header;
              for (p_Var25 = p_Var24; p_Var25 != (_Base_ptr)0x0;
                  p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < iVar31]) {
                if (iVar31 <= (int)p_Var25[1]._M_color) {
                  p_Var21 = p_Var25;
                }
              }
              p_Var25 = &p_Var1->_M_header;
              if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
                 (p_Var25 = p_Var21, iVar31 < (int)p_Var21[1]._M_color)) {
                p_Var25 = &p_Var1->_M_header;
              }
              group = (string *)(ulong)((_Rb_tree_header *)p_Var25 != p_Var1);
            }
            if (iVar19 == 0) goto LAB_00127b2d;
            poVar30 = poVar30 + 1;
          } while (poVar30 != poVar14);
          group = (string *)0x0;
        }
LAB_00127b2d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._0_8_ != &local_d08) {
          operator_delete((void *)local_d18._0_8_,(ulong)(local_d08._M_allocated_capacity + 1));
        }
        if (((ulong)group & 1) == 0) {
          uStack_a58 = (uint)(local_a60 == pce_sprite) * 8 + 8;
        }
        local_d18._0_8_ = &local_d08;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d18,"tile-height","");
        p_Var25 = local_bb8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar14 = local_c28;
        uVar10 = local_d18._0_8_;
        poVar30 = poStack_c30;
        if (poStack_c30 == local_c28) {
          group = (string *)0x0;
          p_Var25 = p_Var24;
        }
        else {
          do {
            iVar31 = poVar30->val;
            iVar19 = strcmp(poVar30->name,(char *)uVar10);
            if (iVar19 == 0) {
              p_Var1 = &local_bb8._M_impl.super__Rb_tree_header;
              p_Var21 = &p_Var1->_M_header;
              for (p_Var24 = p_Var25; p_Var24 != (_Base_ptr)0x0;
                  p_Var24 = (&p_Var24->_M_left)[(int)p_Var24[1]._M_color < iVar31]) {
                if (iVar31 <= (int)p_Var24[1]._M_color) {
                  p_Var21 = p_Var24;
                }
              }
              p_Var24 = &p_Var1->_M_header;
              if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
                 (p_Var24 = p_Var21, iVar31 < (int)p_Var21[1]._M_color)) {
                p_Var24 = &p_Var1->_M_header;
              }
              group = (string *)(ulong)((_Rb_tree_header *)p_Var24 != p_Var1);
            }
            if (iVar19 == 0) goto LAB_00127c28;
            poVar30 = poVar30 + 1;
          } while (poVar30 != poVar14);
          group = (string *)0x0;
        }
LAB_00127c28:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._0_8_ != &local_d08) {
          operator_delete((void *)local_d18._0_8_,(ulong)(local_d08._M_allocated_capacity + 1));
        }
        if (((ulong)group & 1) == 0) {
          uStack_a54 = (uint)(local_a60 == pce_sprite) * 8 + 8;
        }
        local_d18._0_8_ = &local_d08;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d18,"no-flip","");
        p_Var24 = local_bb8._M_impl.super__Rb_tree_header._M_header._M_parent;
        poVar14 = local_c28;
        uVar10 = local_d18._0_8_;
        poVar30 = poStack_c30;
        if (poStack_c30 == local_c28) {
          group = (string *)0x0;
          p_Var24 = p_Var25;
        }
        else {
          do {
            iVar31 = poVar30->val;
            iVar19 = strcmp(poVar30->name,(char *)uVar10);
            if (iVar19 == 0) {
              p_Var1 = &local_bb8._M_impl.super__Rb_tree_header;
              p_Var21 = &p_Var1->_M_header;
              for (p_Var25 = p_Var24; p_Var25 != (_Base_ptr)0x0;
                  p_Var25 = (&p_Var25->_M_left)[(int)p_Var25[1]._M_color < iVar31]) {
                if (iVar31 <= (int)p_Var25[1]._M_color) {
                  p_Var21 = p_Var25;
                }
              }
              p_Var25 = &p_Var1->_M_header;
              if (((_Rb_tree_header *)p_Var21 != p_Var1) &&
                 (p_Var25 = p_Var21, iVar31 < (int)p_Var21[1]._M_color)) {
                p_Var25 = &p_Var1->_M_header;
              }
              group = (string *)(ulong)((_Rb_tree_header *)p_Var25 != p_Var1);
            }
            if (iVar19 == 0) goto LAB_00127d23;
            poVar30 = poVar30 + 1;
          } while (poVar30 != poVar14);
          group = (string *)0x0;
        }
LAB_00127d23:
        iVar31 = (int)p_Var24;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d18._0_8_ != &local_d08) {
          operator_delete((void *)local_d18._0_8_,(ulong)(local_d08._M_allocated_capacity + 1));
        }
        if (((ulong)group & 1) == 0) {
          abStack_a4e[0] = true;
          if (local_a60 - snes < 0xe) {
            abStack_a4e[0] = (bool)(&DAT_001614e8)[local_a60 - snes];
          }
        }
        if (local_a44[0] == true) {
          bStack_a4f = true;
          abStack_a4e[0] = true;
        }
        bVar15 = local_a40._M_string_length != 0;
        bVar8 = true;
        if (local_a40._M_string_length == 0) {
          uVar26 = 0;
        }
        else {
          uVar26 = sfc::from_hexstring(&local_a40);
        }
        goto LAB_00126937;
      }
      local_d18._0_8_ = "0.11.0";
      local_d08._M_allocated_capacity = 0x15fce6;
      local_cf8 = 0x15fd10;
      uStack_cf3 = 0;
      args.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d18;
      args.desc_ = 0xccc;
      fmt_01.size_ = 0x19;
      fmt_01.data_ = "\nSuperFamiconv {}\n{}\n\n{}\n";
      ::fmt::v10::vprint(fmt_01,args);
    }
    bVar8 = false;
    uVar26 = 0;
    bVar15 = false;
    iVar31 = 0;
  }
  else {
    iVar31 = 1;
    bVar8 = false;
    uVar26 = 0;
    bVar15 = false;
  }
LAB_00126937:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b80._M_p != local_9f0) {
    operator_delete(local_b80._M_p,
                    CONCAT71(local_b70._M_allocated_capacity._1_7_,local_b70._M_local_buf[0]) + 1);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_bb8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_be8);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>,_std::_Select1st<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>_>
               *)&local_c18);
  if (poStack_c30 != (pointer)0x0) {
    operator_delete(poStack_c30,(long)p_Stack_c20 - (long)poStack_c30);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_c60);
  MVar18 = extraout_EDX;
  if ((undefined1 *)local_c88._0_8_ != local_c88 + 0x10) {
    operator_delete((void *)local_c88._0_8_,(ulong)(local_c78._M_allocated_capacity + 1));
    MVar18 = extraout_EDX_00;
  }
  if (local_de8 != (undefined1  [8])&local_dd8) {
    operator_delete((void *)local_de8,(ulong)(local_dd8._M_allocated_capacity + 1));
    MVar18 = extraout_EDX_01;
  }
  if (!bVar8) goto LAB_00127a05;
  if ((pointer)local_b60._8_8_ == (pointer)0x0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar20,"Input image required");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e41 == true) {
    sfc::mode_abi_cxx11_((string *)local_c88,(sfc *)(ulong)local_a60,MVar18);
    local_d18._0_8_ = local_c88._0_8_;
    local_d18._8_8_ = local_c88._8_8_;
    args_00.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d18;
    args_00.desc_ = 0xd;
    fmt_02.size_ = 0x23;
    fmt_02.data_ = "Performing conversion in \"{}\" mode\n";
    ::fmt::v10::vprint(fmt_02,args_00);
    if ((undefined1 *)local_c88._0_8_ != local_c88 + 0x10) {
      operator_delete((void *)local_c88._0_8_,(ulong)(local_c78._M_allocated_capacity + 1));
    }
  }
  sfc::Image::Image((Image *)local_c88,(string *)local_b60);
  if (local_e41 == true) {
    sfc::Image::description_abi_cxx11_((string *)local_de8,(Image *)local_c88);
    local_d18._0_8_ = local_b60._0_8_;
    local_d18._8_8_ = local_b60._8_8_;
    local_d08._M_allocated_capacity = (size_type)local_de8;
    local_d08._8_4_ = (uint)uStack_de0;
    local_d08._12_4_ = uStack_de0._4_4_;
    args_01.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d18;
    args_01.desc_ = 0xdd;
    fmt_03.size_ = 0x1c;
    fmt_03.data_ = "Loaded image from \"{}\" ({})\n";
    ::fmt::v10::vprint(fmt_03,args_01);
    if (local_de8 != (undefined1  [8])&local_dd8) {
      operator_delete((void *)local_de8,(ulong)(local_dd8._M_allocated_capacity + 1));
    }
  }
  if (((pointer)local_a80._M_string_length != (pointer)0x0) &&
     (sfc::Image::save_scaled((Image *)local_c88,&local_a80,local_a60), local_e41 == true)) {
    local_d18._0_8_ = local_a80._M_dataplus._M_p;
    local_d18._8_8_ = local_a80._M_string_length;
    args_02.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d18;
    args_02.desc_ = 0xd;
    fmt_04.size_ = 0x35;
    fmt_04.data_ = "Saved image scaled to destination colorspace to \"{}\"\n";
    ::fmt::v10::vprint(fmt_04,args_02);
  }
  if ((local_a60 == pce_sprite) &&
     (((local_c88._0_8_ & 0xf) != 0 || ((local_c88._0_8_ & 0xf00000000) != 0)))) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar20,"pce/sprite-mode requires image dimensions to be a multiple of 16");
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_e38._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1;
  local_e38._max_colors_per_subpalette = 0;
  local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
  local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
  local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  local_e38._col0 = 0;
  local_e38._col0_is_shared = false;
  uVar16 = sfc::default_palette_count_for_mode(local_a60);
  uVar29 = 1;
  for (uVar17 = uStack_a5c; uVar28 = (uint)uVar29, uVar17 != 0; uVar17 = uVar17 - 1) {
    uVar29 = (ulong)(uVar28 * 2);
  }
  if (bStack_a50 == true) {
    if ((int)((ulong)((long)local_c48.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 2) == 0) {
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar20,"no-remap requires indexed color image");
      __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_e41 == true) {
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_d18;
      fmt_05.size_ = 0x32;
      fmt_05.data_ = "Mapping palette straight from indexed color image\n";
      ::fmt::v10::vprint(fmt_05,(format_args)(auVar2 << 0x40));
    }
    local_de8 = (undefined1  [8])
                local_e38._subpalettes.
                super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_d18._4_4_ = uVar16;
    local_d18._0_4_ = local_a60;
    local_d18._8_4_ = uVar28;
    local_cf0 = 0;
    uStack_cec = uStack_cec & 0xffffff00;
    local_e38._mode = local_a60;
    local_e38._max_subpalettes = uVar16;
    uStack_de0 = (pointer)CONCAT35(local_e38._subpalettes.
                                   super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._5_3_,
                                   local_e38._subpalettes.
                                   super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_5_);
    local_dd8._M_allocated_capacity =
         CONCAT35(local_e38._subpalettes.
                  super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._5_3_,
                  local_e38._subpalettes.
                  super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_5_);
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    local_d08._M_allocated_capacity = 0;
    local_d08._8_4_ = 0;
    local_d08._12_4_ = 0;
    local_cf8 = 0;
    uStack_cf3 = 0;
    local_e38._max_colors_per_subpalette = uVar28;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_de8);
    local_e38._col0 = local_cf0;
    local_e38._col0_is_shared = (bool)(undefined1)uStack_cec;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)&local_d08);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d18,&local_c48);
    sfc::Palette::add_colors(&local_e38,(rgba_vec_t *)local_d18,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d18._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_d18._0_8_,local_d08._M_allocated_capacity - local_d18._0_8_);
    }
  }
  else {
    if (local_e41 == true) {
      local_d18._0_8_ = ZEXT48(uVar16);
      args_03.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d18;
      args_03.desc_ = 0x22;
      fmt_06.size_ = 0x2a;
      fmt_06.data_ = "Mapping optimized palette ({}x{} entries)\n";
      local_d08._M_allocated_capacity = uVar29;
      ::fmt::v10::vprint(fmt_06,args_03);
    }
    local_de8 = (undefined1  [8])
                local_e38._subpalettes.
                super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_d18._4_4_ = uVar16;
    local_d18._0_4_ = local_a60;
    local_d18._8_4_ = uVar28;
    local_cf0 = 0;
    uStack_cec = uStack_cec & 0xffffff00;
    local_e38._mode = local_a60;
    local_e38._max_subpalettes = uVar16;
    uStack_de0 = (pointer)CONCAT35(local_e38._subpalettes.
                                   super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._5_3_,
                                   local_e38._subpalettes.
                                   super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>
                                   ._M_impl.super__Vector_impl_data._M_finish._0_5_);
    local_dd8._M_allocated_capacity =
         CONCAT35(local_e38._subpalettes.
                  super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._5_3_,
                  local_e38._subpalettes.
                  super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_5_);
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_5_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_finish._5_3_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
    local_e38._subpalettes.super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    local_d08._M_allocated_capacity = 0;
    local_d08._8_4_ = 0;
    local_d08._12_4_ = 0;
    local_cf8 = 0;
    uStack_cf3 = 0;
    local_e38._max_colors_per_subpalette = uVar28;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)local_de8);
    local_e38._col0 = local_cf0;
    local_e38._col0_is_shared = (bool)(undefined1)uStack_cec;
    std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector
              ((vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_> *)&local_d08);
    if (!bVar15) {
      aVar27 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                )0x1;
      sfc::Image::crop((Image *)local_d18,(Image *)local_c88,0,0,1,1,local_a60);
      sfc::Image::rgba_data(&local_48,(Image *)local_d18);
      uVar26 = *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&local_cc0);
      if (local_cd8 != (pointer)0x0) {
        operator_delete(local_cd8,(long)local_cc8 - (long)local_cd8);
      }
      pvVar5 = (void *)CONCAT44(uStack_cec,local_cf0);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_ce0 - (long)pvVar5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d08._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_d08._M_allocated_capacity,
                        CONCAT35(uStack_cf3,local_cf8) - local_d08._0_8_);
      }
    }
    if (local_a44[0] == true) {
      uVar26 = 0;
      if (local_e41 == true) {
        uVar26 = 0;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_de8;
        fmt_07.size_ = 0x22;
        fmt_07.data_ = "Setting color zero to transparent\n";
        ::fmt::v10::vprint(fmt_07,(format_args)(auVar3 << 0x40));
      }
LAB_00126f60:
      sfc::Palette::prime_col0(&local_e38,uVar26);
    }
    else if (((bVar15) || (gg < local_a60)) || ((0x18018U >> (local_a60 & (gg|sms)) & 1) == 0)) {
      if (local_e41 == true) {
        local_de8 = (undefined1  [8])
                    (ulong)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 |
                           uVar26 << 0x18);
        local_dd8._M_allocated_capacity = 0x16107a;
        puStack_dc8 = (pointer)0x8;
        fmt.size_ = 0x1c2;
        fmt.data_ = (char *)0xc;
        args_15.field_1.args_ = aVar27.args_;
        args_15.desc_ = (unsigned_long_long)local_de8;
        ::fmt::v10::vformat_abi_cxx11_((string *)local_d58,(v10 *)"{1}{0:0{2}x}",fmt,args_15);
        local_de8 = (undefined1  [8])local_d58._0_8_;
        uStack_de0 = (pointer)local_d58._8_8_;
        args_04.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
        args_04.desc_ = 0xd;
        fmt_08.size_ = 0x19;
        fmt_08.data_ = "Setting color zero to {}\n";
        ::fmt::v10::vprint(fmt_08,args_04);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d58._0_8_ != &local_d48) {
          operator_delete((void *)local_d58._0_8_,
                          CONCAT17(local_d48._M_local_buf[7],
                                   CONCAT16(local_d48._M_local_buf[6],
                                            CONCAT24(local_d48._M_allocated_capacity._4_2_,
                                                     local_d48._M_allocated_capacity._0_4_))) + 1);
        }
      }
      goto LAB_00126f60;
    }
    sfc::Image::crops(&local_60,(Image *)local_c88,uStack_a58,uStack_a54,local_a60);
    sfc::Palette::add_images(&local_e38,&local_60);
    std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_60);
    sfc::Palette::sort(&local_e38);
  }
  if (local_e41 == true) {
    sfc::Palette::description_abi_cxx11_((string *)local_de8,&local_e38);
    local_d58._0_8_ = local_de8;
    local_d58._8_8_ = uStack_de0;
    args_05.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_d58;
    args_05.desc_ = 0xd;
    fmt_09.size_ = 0x18;
    fmt_09.data_ = "Created palette with {}\n";
    ::fmt::v10::vprint(fmt_09,args_05);
    if (local_de8 != (undefined1  [8])&local_dd8) {
      operator_delete((void *)local_de8,(ulong)(local_dd8._M_allocated_capacity + 1));
    }
  }
  bVar15 = bStack_a50;
  uVar26 = uStack_a54;
  MVar18 = local_a60;
  pSVar6 = (pointer)CONCAT44(uStack_a58,uStack_a5c);
  uVar7 = CONCAT11(abStack_a4e[0],bStack_a4f);
  local_d48._8_4_ = sfc::max_tile_count_for_mode(local_a60);
  local_d58._0_8_ = (ulong)MVar18 << 0x20;
  local_d48._M_allocated_capacity._0_4_ = uVar26;
  local_d48._M_local_buf[6] = bVar15;
  local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d58._8_8_ = pSVar6;
  local_d48._M_allocated_capacity._4_2_ = uVar7;
  sfc::Image::crops(&local_e08,(Image *)local_c88,uStack_a58,uStack_a54,local_a60);
  pIVar9 = local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    image = local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
            super__Vector_impl_data._M_start;
    do {
      sfc::Tileset::add((Tileset *)local_d58,image,&local_e38);
      image = image + 1;
    } while (image != pIVar9);
  }
  uVar29 = (ulong)(uint)local_d48._8_4_;
  if ((uVar29 != 0) &&
     (uVar23 = ((long)local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3,
     uVar29 <= uVar23 && uVar23 - uVar29 != 0)) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_de8 = (undefined1  [8])
                (ulong)(uint)((int)((ulong)((long)local_d38.
                                                  super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)local_d38.
                                                 super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x45d1745d);
    local_dd8._M_allocated_capacity = (size_type)(uint)local_d48._8_4_;
    fmt_00.size_ = 0x22;
    fmt_00.data_ = (char *)0x3f;
    args_16.field_1.args_ = aVar27.args_;
    args_16.desc_ = (unsigned_long_long)local_de8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_a20,
               (v10 *)"Tileset exceeds maximum size ({} entries generated, {} maximum)",fmt_00,
               args_16);
    std::runtime_error::runtime_error(prVar20,(string *)&local_a20);
    __cxa_throw(prVar20,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e41 == true) {
    uVar29 = ((long)local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_d38.super__Vector_base<sfc::Tile,_std::allocator<sfc::Tile>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    if (bStack_a4f == true) {
      local_de8 = (undefined1  [8])(uVar29 & 0xffffffff);
      args_06.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
      args_06.desc_ = 2;
      fmt_10.size_ = 0x20;
      fmt_10.data_ = "Created tileset with {} entries\n";
      ::fmt::v10::vprint(fmt_10,args_06);
    }
    else {
      local_de8 = (undefined1  [8])(uVar29 & 0xffffffff);
      local_dd8._M_allocated_capacity = local_d58._0_8_ & 0xffffffff;
      args_07.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
      args_07.desc_ = 0x22;
      fmt_11.size_ = 0x49;
      fmt_11.data_ = "Created optimized tileset with {} entries (discarded {} redundant tiles)\n";
      ::fmt::v10::vprint(fmt_11,args_07);
    }
  }
  std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_e08);
  uVar26 = (uint)((int)local_c88._0_4_ % (int)uStack_a58 != 0);
  if ((int)local_c88._0_4_ < 0 == 0 < (int)uStack_a58) {
    uVar26 = 0;
  }
  uVar26 = uVar26 + (int)local_c88._0_4_ / (int)uStack_a58;
  uVar17 = (uint)((int)local_c88._4_4_ % (int)uStack_a54 != 0);
  if ((long)local_c88._0_8_ < 0 == 0 < (int)uStack_a54) {
    uVar17 = 0;
  }
  uVar17 = uVar17 + (int)local_c88._4_4_ / (int)uStack_a54;
  uVar16 = uStack_a54 * uVar17;
  if ((uStack_a58 * uVar26 != local_c88._0_4_) || (uVar16 != local_c88._4_4_)) {
    sfc::Image::crop((Image *)local_de8,(Image *)local_c88,0,0,uStack_a58 * uVar26,uVar16,local_a60)
    ;
    puVar11 = puStack_c68;
    uVar10 = local_c78._M_allocated_capacity;
    local_c88._0_8_ = local_de8;
    local_c88._8_8_ = uStack_de0;
    local_c78._M_allocated_capacity = local_dd8._M_allocated_capacity;
    local_c78._8_8_ = local_dd8._8_8_;
    puStack_c68 = puStack_dc8;
    local_dd8._M_allocated_capacity = 0;
    local_dd8._8_8_ = 0;
    puStack_dc8 = (pointer)0x0;
    if ((char *)uVar10 != (char *)0x0) {
      operator_delete((void *)uVar10,(long)puVar11 - uVar10);
    }
    p_Var24 = p_Stack_c50;
    puVar11 = local_c60;
    local_c60 = local_dc0;
    local_c58 = puStack_db8;
    p_Stack_c50 = p_Stack_db0;
    local_dc0 = (pointer)0x0;
    puStack_db8 = (pointer)0x0;
    p_Stack_db0 = (_Base_ptr)0x0;
    if (puVar11 != (pointer)0x0) {
      operator_delete(puVar11,(long)p_Var24 - (long)puVar11);
    }
    puVar13 = local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    puVar12 = local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = &local_da8->_M_color;
    local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = &p_Stack_da0->_M_color;
    local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puStack_d98;
    local_da8 = (_Base_ptr)0x0;
    p_Stack_da0 = (_Base_ptr)0x0;
    puStack_d98 = (pointer)0x0;
    if ((_Base_ptr)puVar12 != (_Base_ptr)0x0) {
      operator_delete(puVar12,(long)puVar13 - (long)puVar12);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
             *)&poStack_c30);
    if (local_d90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_d90._M_impl.super__Rb_tree_header;
      local_c28 = (pointer)CONCAT44(local_c28._4_4_,
                                    local_d90._M_impl.super__Rb_tree_header._M_header._M_color);
      p_Stack_c20 = local_d90._M_impl.super__Rb_tree_header._M_header._M_parent;
      local_c18 = local_d90._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Stack_c10 = local_d90._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_d90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           (_Base_ptr)&local_c28;
      local_c08 = (_Base_ptr)local_d90._M_impl.super__Rb_tree_header._M_node_count;
      local_d90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_d90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d90);
    if (local_da8 != (_Base_ptr)0x0) {
      operator_delete(local_da8,(long)puStack_d98 - (long)local_da8);
    }
    if (local_dc0 != (pointer)0x0) {
      operator_delete(local_dc0,(long)p_Stack_db0 - (long)local_dc0);
    }
    if ((char *)local_dd8._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_dd8._M_allocated_capacity,(long)puStack_dc8 - local_dd8._0_8_);
    }
  }
  sfc::Map::Map(&local_a20,local_a60,uVar26,uVar17,uStack_a58,uStack_a54);
  if (local_a60 != pce_sprite) {
    sfc::Image::crops(&local_e08,(Image *)local_c88,uStack_a58,uStack_a54,local_a60);
    if (local_e41 == true) {
      local_de8 = (undefined1  [8])
                  (((long)local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f);
      local_dd8._M_allocated_capacity = (size_type)uStack_a58;
      puStack_dc8 = (pointer)(ulong)uStack_a54;
      args_08.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
      args_08.desc_ = 0x224;
      fmt_12.size_ = 0x24;
      fmt_12.data_ = "Mapping {} {}x{}px tiles from image\n";
      ::fmt::v10::vprint(fmt_12,args_08);
    }
    if (local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar29 = 0;
      do {
        sfc::Map::add(&local_a20,
                      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar29,(Tileset *)local_d58,&local_e38,
                      uStack_a5c,(uint)(uVar29 % (ulong)uVar26),(uint)(uVar29 / uVar26));
        uVar29 = (ulong)((int)uVar29 + 1);
        uVar23 = ((long)local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0xf0f0f0f0f0f0f0f;
      } while (uVar29 <= uVar23 && uVar23 - uVar29 != 0);
    }
    if (local_a4c[0] != 0) {
      sfc::Map::add_base_offset(&local_a20,local_a4c[0]);
    }
    if (local_a4c[1] != 0) {
      sfc::Map::add_palette_base_offset(&local_a20,local_a4c[1]);
    }
    std::vector<sfc::Image,_std::allocator<sfc::Image>_>::~vector(&local_e08);
  }
  if (((pointer)local_b60._40_8_ != (pointer)0x0) &&
     (sfc::Palette::save(&local_e38,(string *)(local_b60 + 0x20)), local_e41 == true)) {
    local_de8 = (undefined1  [8])local_b60._32_8_;
    uStack_de0 = (pointer)local_b60._40_8_;
    args_09.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
    args_09.desc_ = 0xd;
    fmt_13.size_ = 0x22;
    fmt_13.data_ = "Saved native palette data to \"{}\"\n";
    ::fmt::v10::vprint(fmt_13,args_09);
  }
  if (((pointer)local_b60._72_8_ != (pointer)0x0) &&
     (sfc::Tileset::save((Tileset *)local_d58,(string *)(local_b60 + 0x40)), local_e41 == true)) {
    local_de8 = (undefined1  [8])local_b60._64_8_;
    uStack_de0 = (pointer)local_b60._72_8_;
    args_10.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
    args_10.desc_ = 0xd;
    fmt_14.size_ = 0x1f;
    fmt_14.data_ = "Saved native tile data to \"{}\"\n";
    ::fmt::v10::vprint(fmt_14,args_10);
  }
  if ((pointer)local_b60._104_8_ != (pointer)0x0) {
    if (local_a60 == pce_sprite) {
      fmt_19.size_ = 0x2c;
      fmt_19.data_ = "Map output not available in pce_sprite mode\n";
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_de8;
      ::fmt::v10::vprint(_stderr,fmt_19,(format_args)(auVar4 << 0x40));
    }
    else {
      sfc::Map::save(&local_a20,(string *)(local_b60 + 0x60),false,0,0);
      if (local_e41 == true) {
        local_de8 = (undefined1  [8])local_b60._96_8_;
        uStack_de0 = (pointer)local_b60._104_8_;
        args_11.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
        args_11.desc_ = 0xd;
        fmt_15.size_ = 0x1e;
        fmt_15.data_ = "Saved native map data to \"{}\"\n";
        ::fmt::v10::vprint(fmt_15,args_11);
      }
    }
  }
  if (((pointer)local_ac0._M_string_length != (pointer)0x0) &&
     (sfc::Palette::save_act(&local_e38,&local_ac0), local_e41 == true)) {
    local_de8 = (undefined1  [8])local_ac0._M_dataplus._M_p;
    uStack_de0 = (pointer)local_ac0._M_string_length;
    args_12.field_1.values_ =
         (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)local_de8;
    args_12.desc_ = 0xd;
    fmt_16.size_ = 0x20;
    fmt_16.data_ = "Saved photoshop palette to \"{}\"\n";
    ::fmt::v10::vprint(fmt_16,args_12);
  }
  if ((Image *)local_b60._136_8_ != (Image *)0x0) {
    sfc::Image::Image((Image *)local_de8,&local_e38);
    sfc::Image::save((Image *)local_de8,(string *)(local_b60 + 0x80));
    if (local_e41 == true) {
      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_b60._128_8_;
      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_b60._136_8_;
      args_13.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_e08;
      args_13.desc_ = 0xd;
      fmt_17.size_ = 0x1c;
      fmt_17.data_ = "Saved palette image to \"{}\"\n";
      ::fmt::v10::vprint(fmt_17,args_13);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d90);
    if (local_da8 != (_Base_ptr)0x0) {
      operator_delete(local_da8,(long)puStack_d98 - (long)local_da8);
    }
    if (local_dc0 != (pointer)0x0) {
      operator_delete(local_dc0,(long)p_Stack_db0 - (long)local_dc0);
    }
    if ((char *)local_dd8._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_dd8._M_allocated_capacity,(long)puStack_dc8 - local_dd8._0_8_);
    }
  }
  if ((Image *)local_aa0._8_8_ != (Image *)0x0) {
    sfc::Image::Image((Image *)local_de8,(Tileset *)local_d58,0x80);
    sfc::Image::save((Image *)local_de8,(string *)local_aa0);
    if (local_e41 == true) {
      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_aa0._0_8_;
      local_e08.super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_aa0._8_8_;
      args_14.field_1.values_ =
           (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_e08;
      args_14.desc_ = 0xd;
      fmt_18.size_ = 0x1c;
      fmt_18.data_ = "Saved tileset image to \"{}\"\n";
      ::fmt::v10::vprint(fmt_18,args_14);
    }
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&local_d90);
    if (local_da8 != (_Base_ptr)0x0) {
      operator_delete(local_da8,(long)puStack_d98 - (long)local_da8);
    }
    if (local_dc0 != (pointer)0x0) {
      operator_delete(local_dc0,(long)p_Stack_db0 - (long)local_dc0);
    }
    if ((char *)local_dd8._M_allocated_capacity != (char *)0x0) {
      operator_delete((void *)local_dd8._M_allocated_capacity,(long)puStack_dc8 - local_dd8._0_8_);
    }
  }
  if (local_a20._entries.super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a20._entries.
                    super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a20._entries.
                          super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a20._entries.
                          super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<sfc::Tile,_std::allocator<sfc::Tile>_>::~vector(&local_d38);
  std::vector<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>::~vector(&local_e38._subpalettes);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               *)&poStack_c30);
  if ((_Base_ptr)
      local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (_Base_ptr)0x0) {
    operator_delete(local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c60 != (pointer)0x0) {
    operator_delete(local_c60,(long)p_Stack_c50 - (long)local_c60);
  }
  if ((char *)local_c78._M_allocated_capacity != (char *)0x0) {
    operator_delete((void *)local_c78._M_allocated_capacity,(long)puStack_c68 - local_c78._0_8_);
  }
  iVar31 = 0;
LAB_00127a05:
  Settings::~Settings((Settings *)local_b60);
  return iVar31;
}

Assistant:

int superfamiconv(int argc, char* argv[]) {
  Settings settings = {};
  bool verbose = false;
  bool col0_forced = false;
  rgba_t col0 = 0;

  try {
    bool help;
    bool license;
    std::string mode_str;

    Options options;
    options.IndentDescription = sfc::Constants::options_indent;

    // clang-format off
    options.Header =
      "Usage: superfamiconv <command> [<options>]\n\n"

      "Available commands: palette, tiles, map or blank for \"shorthand mode\"\n"
      "Invoke with <command> --help for further help\n\n"

      "Shorthand mode options:\n";

    options.Add(settings.in_image,            'i', "in-image",             "Input: image");
    options.Add(settings.out_palette,         'p', "out-palette",          "Output: palette data");
    options.Add(settings.out_tiles,           't', "out-tiles",            "Output: tile data");
    options.Add(settings.out_map,             'm', "out-map",              "Output: map data");
    options.Add(settings.out_palette_image,   '\0', "out-palette-image",    "Output: palette image");
    options.Add(settings.out_palette_act,     '\0', "out-palette-act",      "Output: photoshop palette");
    options.Add(settings.out_tiles_image,     '\0', "out-tiles-image",      "Output: tiles image");
    options.Add(settings.out_scaled_image,    '\0', "out-scaled-image",     "Output: image scaled to destination colorspace");

    options.Add(mode_str,                     'M', "mode",                 "Mode <default: snes>",              std::string("snes"), "Settings");
    options.Add(settings.bpp,                 'B', "bpp",                  "Bits per pixel",                    unsigned(4),         "Settings");
    options.Add(settings.tile_w,              'W', "tile-width",           "Tile width",                        unsigned(8),         "Settings");
    options.Add(settings.tile_h,              'H', "tile-height",          "Tile height",                       unsigned(8),         "Settings");
    options.AddSwitch(settings.no_remap,      'R', "no-remap",             "Don't remap colors",                false,               "Settings");
    options.AddSwitch(settings.no_discard,    'D', "no-discard",           "Don't discard redundant tiles",     false,               "Settings");
    options.AddSwitch(settings.no_flip,       'F', "no-flip",              "Don't discard using tile flipping", false,               "Settings");
    options.Add(settings.tile_base_offset,    'T', "tile-base-offset",     "Tile base offset for map data",     int(0),              "Settings");
    options.Add(settings.palette_base_offset, 'P', "palette-base-offset",  "Palette base offset for map data",  int(0),              "Settings");
    options.AddSwitch(settings.sprite_mode,   'S', "sprite-mode",          "Apply sprite output settings",      false,               "Settings");
    options.Add(settings.color_zero,          '\0', "color-zero",           "Set color #0", std::string(),                           "Settings");

    options.AddSwitch(verbose,                'v', "verbose",              "Verbose logging", false, "_");
    options.AddSwitch(license,                'l', "license",              "Show licenses",   false, "_");
    options.AddSwitch(help,                   'h', "help",                 "Show this help",  false, "_");
    // clang-format on

    if (!options.Parse(argc, argv))
      return 1;

    if (argc <= 1 || help) {
      std::cout << options.Usage();
      return 0;
    }

    if (license) {
      fmt::print("\nSuperFamiconv {}\n{}\n\n{}\n", sfc::about::VERSION, sfc::about::COPYRIGHT, sfc::about::LICENSE);
      return 0;
    }

    settings.mode = sfc::mode(mode_str);

    // Set pce_sprite mode and sprite_mode interchangeably
    if (settings.sprite_mode && settings.mode == sfc::Mode::pce)
      settings.mode = sfc::Mode::pce_sprite;
    if (settings.mode == sfc::Mode::pce_sprite)
      settings.sprite_mode = true;

    // Mode-specific defaults
    if (!options.WasSet("bpp"))
      settings.bpp = sfc::default_bpp_for_mode(settings.mode);
    if (!options.WasSet("tile-width"))
      settings.tile_w = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("tile-height"))
      settings.tile_h = sfc::default_tile_size_for_mode(settings.mode);
    if (!options.WasSet("no-flip"))
      settings.no_flip = !sfc::tile_flipping_allowed_for_mode(settings.mode);

    // Sprite mode defaults
    if (settings.sprite_mode) {
      settings.no_discard = settings.no_flip = true;
    }

    if (!settings.color_zero.empty()) {
      col0 = sfc::from_hexstring(settings.color_zero);
      col0_forced = true;
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  try {
    if (settings.in_image.empty())
      throw std::runtime_error("Input image required");

    if (verbose)
      fmt::print("Performing conversion in \"{}\" mode\n", sfc::mode(settings.mode));

    sfc::Image image(settings.in_image);
    if (verbose)
      fmt::print("Loaded image from \"{}\" ({})\n", settings.in_image, image.description());

    // Write color-scaled image
    if (!settings.out_scaled_image.empty()) {
      image.save_scaled(settings.out_scaled_image, settings.mode);
      if (verbose)
        fmt::print("Saved image scaled to destination colorspace to \"{}\"\n", settings.out_scaled_image);
    }

    if (settings.mode == sfc::Mode::pce_sprite) {
      if (image.width() % 16 || image.height() % 16)
        throw std::runtime_error("pce/sprite-mode requires image dimensions to be a multiple of 16");
    }

    // Make palette
    sfc::Palette palette;
    {
      unsigned palette_count = sfc::default_palette_count_for_mode(settings.mode);
      unsigned colors_per_palette = sfc::palette_size_at_bpp(settings.bpp);

      if (settings.no_remap) {
        if (image.palette_size() == 0)
          throw std::runtime_error("no-remap requires indexed color image");
        if (verbose)
          fmt::print("Mapping palette straight from indexed color image\n");

        palette = sfc::Palette(settings.mode, palette_count, colors_per_palette);
        palette.add_colors(image.palette());

      } else {
        if (verbose)
          fmt::print("Mapping optimized palette ({}x{} entries)\n", palette_count, colors_per_palette);

        palette = sfc::Palette(settings.mode, palette_count, colors_per_palette);

        col0 = col0_forced ? col0 : image.crop(0, 0, 1, 1, settings.mode).rgba_data()[0];

        if (settings.sprite_mode) {
          if (verbose)
            fmt::print("Setting color zero to transparent\n");
          palette.prime_col0(sfc::transparent_color);
        } else if (col0_forced || sfc::col0_is_shared_for_mode(settings.mode)) {
          if (verbose)
            fmt::print("Setting color zero to {}\n", sfc::to_hexstring(col0, true, true));
          palette.prime_col0(col0);
        }

        palette.add_images(image.crops(settings.tile_w, settings.tile_h, settings.mode));
        palette.sort();
      }
      if (verbose)
        fmt::print("Created palette with {}\n", palette.description());
    }

    // Make tileset
    sfc::Tileset tileset(settings.mode, settings.bpp, settings.tile_w, settings.tile_h, settings.no_discard, settings.no_flip,
                         settings.no_remap, sfc::max_tile_count_for_mode(settings.mode));
    {
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);

      for (auto& crop : crops)
        tileset.add(crop, &palette);
      if (tileset.is_full()) {
        throw std::runtime_error(
          fmt::format("Tileset exceeds maximum size ({} entries generated, {} maximum)", tileset.size(), tileset.max()));
      }
      if (verbose) {
        if (settings.no_discard) {
          fmt::print("Created tileset with {} entries\n", tileset.size());
        } else {
          fmt::print("Created optimized tileset with {} entries (discarded {} redundant tiles)\n", tileset.size(),
                     tileset.discarded_tiles);
        }
      }
    }

    // Make map
    unsigned map_width = sfc::div_ceil(image.width(), settings.tile_w);
    unsigned map_height = sfc::div_ceil(image.height(), settings.tile_h);

    if (map_width * settings.tile_w != image.width() || map_height * settings.tile_h != image.height()) {
      image = image.crop(0, 0, map_width * settings.tile_w, map_height * settings.tile_h, settings.mode);
    }

    sfc::Map map(settings.mode, map_width, map_height, settings.tile_w, settings.tile_h);
    if (settings.mode != sfc::Mode::pce_sprite) {
      std::vector<sfc::Image> crops = image.crops(settings.tile_w, settings.tile_h, settings.mode);
      if (verbose)
        fmt::print("Mapping {} {}x{}px tiles from image\n", crops.size(), settings.tile_w, settings.tile_h);

      for (unsigned i = 0; i < crops.size(); ++i) {
        map.add(crops[i], tileset, palette, settings.bpp, i % map_width, i / map_width);
      }

      if (settings.tile_base_offset)
        map.add_base_offset(settings.tile_base_offset);

      if (settings.palette_base_offset)
        map.add_palette_base_offset(settings.palette_base_offset);
    }

    // Write data
    if (!settings.out_palette.empty()) {
      palette.save(settings.out_palette);
      if (verbose)
        fmt::print("Saved native palette data to \"{}\"\n", settings.out_palette);
    }

    if (!settings.out_tiles.empty()) {
      tileset.save(settings.out_tiles);
      if (verbose)
        fmt::print("Saved native tile data to \"{}\"\n", settings.out_tiles);
    }

    if (!settings.out_map.empty()) {
      if (settings.mode == sfc::Mode::pce_sprite) {
        fmt::print(stderr, "Map output not available in pce_sprite mode\n");
      } else {
        map.save(settings.out_map);
        if (verbose)
          fmt::print("Saved native map data to \"{}\"\n", settings.out_map);
      }
    }

    if (!settings.out_palette_act.empty()) {
      palette.save_act(settings.out_palette_act);
      if (verbose)
        fmt::print("Saved photoshop palette to \"{}\"\n", settings.out_palette_act);
    }

    if (!settings.out_palette_image.empty()) {
      sfc::Image palette_image(palette);
      palette_image.save(settings.out_palette_image);
      if (verbose)
        fmt::print("Saved palette image to \"{}\"\n", settings.out_palette_image);
    }

    if (!settings.out_tiles_image.empty()) {
      sfc::Image tileset_image(tileset);
      tileset_image.save(settings.out_tiles_image);
      if (verbose)
        fmt::print("Saved tileset image to \"{}\"\n", settings.out_tiles_image);
    }

  } catch (const std::exception& e) {
    fmt::print(stderr, "Error: {}\n", e.what());
    return 1;
  }

  return 0;
}